

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

int rw::Engine::close(int __fd)

{
  FILE *__stream;
  int extraout_EAX;
  int iVar1;
  char *pcVar2;
  uint local_14;
  uint32 local_10;
  uint i;
  Error _e;
  
  if ((engine == 0) || (state != 2)) {
    local_10 = 0;
    i = 0x80000001;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/engine.cpp",0x15d);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000001);
    fprintf(__stream,"%s\n",pcVar2);
    setError((Error *)&stack0xfffffffffffffff0);
    iVar1 = extraout_EAX;
  }
  else {
    (**(code **)(engine + 0x140))(3,0,0);
    for (local_14 = 0; local_14 < 0xd; local_14 = local_14 + 1) {
      (*DAT_001660a8)(*(undefined8 *)(engine + 0x58 + (ulong)local_14 * 8));
    }
    ObjPipeline::destroy(*(ObjPipeline **)(engine + 0x148));
    iVar1 = (*DAT_001660a8)(engine);
    engine = 0;
    state = 1;
  }
  return iVar1;
}

Assistant:

void
Engine::close(void)
{
	if(engine == nil || Engine::state != Opened){
		RWERROR((ERR_GENERAL));
		return;
	}

	engine->device.system(DEVICECLOSE, nil, 0);
	for(uint i = 0; i < NUM_PLATFORMS; i++)
		rwFree(rw::engine->driver[i]);
	engine->dummyDefaultPipeline->destroy();
	rwFree(engine);
	engine = nil;
	Engine::state = Initialized;
}